

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

string * testing::PrintToString<char>(string *__return_storage_ptr__,char *value)

{
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188;
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  internal::UniversalPrinter<char>::Print(value,&local_188);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

::std::string PrintToString(const T& value) {
  ::std::stringstream ss;
  internal::UniversalTersePrinter<T>::Print(value, &ss);
  return ss.str();
}